

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5GetTokenizer
              (Fts5Global *pGlobal,char **azArg,int nArg,Fts5Tokenizer **ppTok,
              fts5_tokenizer **ppTokApi,char **pzErr)

{
  Fts5TokenizerModule *pFVar1;
  char *pcVar2;
  int local_74;
  char *local_58;
  int local_44;
  int rc;
  Fts5TokenizerModule *pMod;
  char **pzErr_local;
  fts5_tokenizer **ppTokApi_local;
  Fts5Tokenizer **ppTok_local;
  int nArg_local;
  char **azArg_local;
  Fts5Global *pGlobal_local;
  
  if (nArg == 0) {
    local_58 = (char *)0x0;
  }
  else {
    local_58 = *azArg;
  }
  pFVar1 = fts5LocateTokenizer(pGlobal,local_58);
  if (pFVar1 == (Fts5TokenizerModule *)0x0) {
    local_44 = 1;
    pcVar2 = sqlite3_mprintf("no such tokenizer: %s",*azArg);
    *pzErr = pcVar2;
  }
  else {
    if (nArg == 0) {
      local_74 = 0;
    }
    else {
      local_74 = nArg + -1;
    }
    local_44 = (*(pFVar1->x).xCreate)(pFVar1->pUserData,azArg + 1,local_74,ppTok);
    *ppTokApi = &pFVar1->x;
    if ((local_44 != 0) && (pzErr != (char **)0x0)) {
      pcVar2 = sqlite3_mprintf("error in tokenizer constructor");
      *pzErr = pcVar2;
    }
  }
  if (local_44 != 0) {
    *ppTokApi = (fts5_tokenizer *)0x0;
    *ppTok = (Fts5Tokenizer *)0x0;
  }
  return local_44;
}

Assistant:

static int sqlite3Fts5GetTokenizer(
  Fts5Global *pGlobal, 
  const char **azArg,
  int nArg,
  Fts5Tokenizer **ppTok,
  fts5_tokenizer **ppTokApi,
  char **pzErr
){
  Fts5TokenizerModule *pMod;
  int rc = SQLITE_OK;

  pMod = fts5LocateTokenizer(pGlobal, nArg==0 ? 0 : azArg[0]);
  if( pMod==0 ){
    assert( nArg>0 );
    rc = SQLITE_ERROR;
    *pzErr = sqlite3_mprintf("no such tokenizer: %s", azArg[0]);
  }else{
    rc = pMod->x.xCreate(pMod->pUserData, &azArg[1], (nArg?nArg-1:0), ppTok);
    *ppTokApi = &pMod->x;
    if( rc!=SQLITE_OK && pzErr ){
      *pzErr = sqlite3_mprintf("error in tokenizer constructor");
    }
  }

  if( rc!=SQLITE_OK ){
    *ppTokApi = 0;
    *ppTok = 0;
  }

  return rc;
}